

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O1

uint32_t secp256k1_testrand_int(uint32_t range)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t uVar4;
  int *in_RSI;
  uint uVar6;
  undefined4 in_register_0000003c;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  uint32_t uVar5;
  
  piVar7 = (int *)CONCAT44(in_register_0000003c,range);
  if (range != 0) {
    uVar2 = 0;
    uVar6 = range - 1;
    if (uVar6 != 0) {
      uVar3 = (ulong)uVar6;
      uVar9 = uVar6;
      do {
        uVar2 = uVar2 * 2 + 1;
        uVar3 = uVar3 >> 1;
        bVar11 = 1 < uVar9;
        uVar9 = (uint)uVar3;
      } while (bVar11);
    }
    do {
      uVar9 = ((int)(secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
              (uint)(secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29)) +
              (int)secp256k1_test_state[0] & uVar2;
      uVar10 = secp256k1_test_state[1] << 0x11;
      uVar3 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar8 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar3;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar8;
      secp256k1_test_state[2] = uVar3 ^ uVar10;
      secp256k1_test_state[3] = uVar8 << 0x2d | uVar8 >> 0x13;
    } while (uVar6 < uVar9);
    return uVar9;
  }
  secp256k1_testrand_int_cold_1();
  uVar4 = 0;
  uVar5 = 0;
  if ((((((piVar7[0x38] == in_RSI[0x38]) && (*piVar7 == *in_RSI)) &&
        (*(long *)(piVar7 + 2) == *(long *)(in_RSI + 2))) &&
       ((uVar4 = uVar5, *(long *)(piVar7 + 4) == *(long *)(in_RSI + 4) &&
        (*(long *)(piVar7 + 6) == *(long *)(in_RSI + 6))))) &&
      ((*(long *)(piVar7 + 8) == *(long *)(in_RSI + 8) &&
       ((iVar1 = secp256k1_gej_eq_var((secp256k1_gej *)(piVar7 + 10),(secp256k1_gej *)(in_RSI + 10))
        , iVar1 != 0 && (*(long *)(piVar7 + 0x30) == *(long *)(in_RSI + 0x30))))))) &&
     ((*(long *)(piVar7 + 0x32) == *(long *)(in_RSI + 0x32) &&
      (*(long *)(piVar7 + 0x34) == *(long *)(in_RSI + 0x34))))) {
    uVar4 = (uint32_t)(*(long *)(piVar7 + 0x36) == *(long *)(in_RSI + 0x36));
  }
  return uVar4;
}

Assistant:

static uint32_t secp256k1_testrand_int(uint32_t range) {
    uint32_t mask = 0;
    uint32_t range_copy;
    /* Reduce range by 1, changing its meaning to "maximum value". */
    VERIFY_CHECK(range != 0);
    range -= 1;
    /* Count the number of bits in range. */
    range_copy = range;
    while (range_copy) {
        mask = (mask << 1) | 1U;
        range_copy >>= 1;
    }
    /* Generation loop. */
    while (1) {
        uint32_t val = secp256k1_testrand64() & mask;
        if (val <= range) return val;
    }
}